

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O2

Key * __thiscall QPixmapCache::Key::operator=(Key *this,Key *other)

{
  int *piVar1;
  KeyData *this_00;
  KeyData *pKVar2;
  
  this_00 = this->d;
  pKVar2 = other->d;
  if (this_00 != pKVar2) {
    if (pKVar2 != (KeyData *)0x0) {
      pKVar2->ref = pKVar2->ref + 1;
    }
    if (this_00 != (KeyData *)0x0) {
      piVar1 = &this_00->ref;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
        operator_delete(this_00,0x28);
        pKVar2 = other->d;
      }
    }
    this->d = pKVar2;
  }
  return this;
}

Assistant:

QPixmapCache::Key &QPixmapCache::Key::operator =(const Key &other)
{
    if (d != other.d) {
        if (other.d)
            ++(other.d->ref);
        if (d && --(d->ref) == 0)
            delete d;
        d = other.d;
    }
    return *this;
}